

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# abcNtk.c
# Opt level: O3

Abc_Ntk_t * Abc_NtkDupDfs(Abc_Ntk_t *pNtk)

{
  long *plVar1;
  Abc_Obj_t *pFanin;
  char *__s;
  int iVar2;
  Abc_Ntk_t *pNtkNew;
  Vec_Ptr_t *pVVar3;
  Abc_Ntk_t *pAVar4;
  size_t sVar5;
  char *__dest;
  uint uVar6;
  long lVar7;
  long lVar8;
  
  if (pNtk == (Abc_Ntk_t *)0x0) {
    pNtkNew = (Abc_Ntk_t *)0x0;
  }
  else {
    if ((pNtk->ntkType | ABC_NTK_LOGIC) == ABC_NTK_STRASH) {
      __assert_fail("!Abc_NtkIsStrash(pNtk) && !Abc_NtkIsNetlist(pNtk)",
                    "/workspace/llm4binary/github/license_all_cmakelists_25/zfchu[P]abc/src/base/abc/abcNtk.c"
                    ,0x1eb,"Abc_Ntk_t *Abc_NtkDupDfs(Abc_Ntk_t *)");
    }
    pNtkNew = Abc_NtkStartFrom(pNtk,pNtk->ntkType,pNtk->ntkFunc);
    pVVar3 = Abc_NtkDfs(pNtk,0);
    if (0 < pVVar3->nSize) {
      lVar7 = 0;
      do {
        Abc_NtkDupObj(pNtkNew,(Abc_Obj_t *)pVVar3->pArray[lVar7],0);
        lVar7 = lVar7 + 1;
      } while (lVar7 < pVVar3->nSize);
    }
    if (pVVar3->pArray != (void **)0x0) {
      free(pVVar3->pArray);
    }
    free(pVVar3);
    pVVar3 = pNtk->vObjs;
    if (0 < pVVar3->nSize) {
      lVar7 = 0;
      do {
        plVar1 = (long *)pVVar3->pArray[lVar7];
        if ((((plVar1 != (long *)0x0) && ((*(uint *)((long)plVar1 + 0x14) & 0xe) != 8)) &&
            (uVar6 = *(uint *)((long)plVar1 + 0x14) & 0xf, uVar6 != 5)) && (uVar6 != 10)) {
          iVar2 = *(int *)((long)plVar1 + 0x1c);
          if (0 < iVar2) {
            lVar8 = 0;
            do {
              if (((Abc_Obj_t *)plVar1[8] != (Abc_Obj_t *)0x0) &&
                 (pFanin = *(Abc_Obj_t **)
                            (*(long *)(*(long *)(*(long *)(*plVar1 + 0x20) + 8) +
                                      (long)*(int *)(plVar1[4] + lVar8 * 4) * 8) + 0x40),
                 pFanin != (Abc_Obj_t *)0x0)) {
                Abc_ObjAddFanin((Abc_Obj_t *)plVar1[8],pFanin);
                iVar2 = *(int *)((long)plVar1 + 0x1c);
              }
              lVar8 = lVar8 + 1;
            } while (lVar8 < iVar2);
            pVVar3 = pNtk->vObjs;
          }
        }
        lVar7 = lVar7 + 1;
      } while (lVar7 < pVVar3->nSize);
    }
    if (pNtk->pExdc != (Abc_Ntk_t *)0x0) {
      pAVar4 = Abc_NtkDup(pNtk->pExdc);
      pNtkNew->pExdc = pAVar4;
    }
    if ((Abc_Ntk_t *)pNtk->pExcare != (Abc_Ntk_t *)0x0) {
      pAVar4 = Abc_NtkDup((Abc_Ntk_t *)pNtk->pExcare);
      pNtkNew->pExcare = pAVar4;
    }
    if (pNtk->pManTime != (Abc_ManTime_t *)0x0) {
      Abc_NtkTimeInitialize(pNtkNew,pNtk);
    }
    if (pNtk->vPhases != (Vec_Int_t *)0x0) {
      Abc_NtkTransferPhases(pNtkNew,pNtk);
    }
    __s = pNtk->pWLoadUsed;
    if (__s != (char *)0x0) {
      sVar5 = strlen(__s);
      __dest = (char *)malloc(sVar5 + 1);
      strcpy(__dest,__s);
      pNtkNew->pWLoadUsed = __dest;
    }
    iVar2 = Abc_NtkCheck(pNtkNew);
    if (iVar2 == 0) {
      fwrite("Abc_NtkDup(): Network check has failed.\n",0x28,1,_stdout);
    }
    pNtk->pCopy = pNtkNew;
  }
  return pNtkNew;
}

Assistant:

Abc_Ntk_t * Abc_NtkDupDfs( Abc_Ntk_t * pNtk )
{
    Vec_Ptr_t * vNodes;
    Abc_Ntk_t * pNtkNew; 
    Abc_Obj_t * pObj, * pFanin;
    int i, k;
    if ( pNtk == NULL )
        return NULL;
    assert( !Abc_NtkIsStrash(pNtk) && !Abc_NtkIsNetlist(pNtk) );
    // start the network
    pNtkNew = Abc_NtkStartFrom( pNtk, pNtk->ntkType, pNtk->ntkFunc );
    // copy the internal nodes
    vNodes = Abc_NtkDfs( pNtk, 0 );
    Vec_PtrForEachEntry( Abc_Obj_t *, vNodes, pObj, i )
        Abc_NtkDupObj( pNtkNew, pObj, 0 );
    Vec_PtrFree( vNodes );
    // reconnect all objects (no need to transfer attributes on edges)
    Abc_NtkForEachObj( pNtk, pObj, i )
        if ( !Abc_ObjIsBox(pObj) && !Abc_ObjIsBo(pObj) )
            Abc_ObjForEachFanin( pObj, pFanin, k )
                if ( pObj->pCopy && pFanin->pCopy )
                    Abc_ObjAddFanin( pObj->pCopy, pFanin->pCopy );
    // duplicate the EXDC Ntk
    if ( pNtk->pExdc )
        pNtkNew->pExdc = Abc_NtkDup( pNtk->pExdc );
    if ( pNtk->pExcare )
        pNtkNew->pExcare = Abc_NtkDup( (Abc_Ntk_t *)pNtk->pExcare );
    // duplicate timing manager
    if ( pNtk->pManTime )
        Abc_NtkTimeInitialize( pNtkNew, pNtk );
    if ( pNtk->vPhases )
        Abc_NtkTransferPhases( pNtkNew, pNtk );
    if ( pNtk->pWLoadUsed )
        pNtkNew->pWLoadUsed = Abc_UtilStrsav( pNtk->pWLoadUsed );
    // check correctness
    if ( !Abc_NtkCheck( pNtkNew ) )
        fprintf( stdout, "Abc_NtkDup(): Network check has failed.\n" );
    pNtk->pCopy = pNtkNew;
    return pNtkNew;
}